

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O0

void __thiscall hwnet::TCPSocket::sendContext::sendContext(sendContext *this,Ptr *buff,size_t len)

{
  element_type *peVar1;
  char *pcVar2;
  size_t sVar3;
  size_t len_local;
  Ptr *buff_local;
  sendContext *this_local;
  
  std::shared_ptr<hwnet::Buffer>::shared_ptr(&this->buff,buff);
  peVar1 = std::__shared_ptr_access<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)buff);
  pcVar2 = Buffer::BuffPtr(peVar1);
  this->ptr = pcVar2;
  this->next = (sendContext *)0x0;
  if (len == 0) {
    peVar1 = std::__shared_ptr_access<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)buff);
    sVar3 = Buffer::Len(peVar1);
    this->len = sVar3;
  }
  else {
    this->len = len;
  }
  return;
}

Assistant:

sendContext(const Buffer::Ptr &buff,size_t len = 0):buff(buff),ptr(buff->BuffPtr()),next(nullptr){
			if(len > 0) {
				this->len = len;
			} else {
				this->len = buff->Len();
			}
		}